

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O0

void __thiscall
ConcurrentStack<Door_*>::ConcurrentStack(ConcurrentStack<Door_*> *this,size_t capacity)

{
  int local_1c;
  size_t local_18;
  size_t capacity_local;
  ConcurrentStack<Door_*> *this_local;
  
  local_18 = capacity;
  capacity_local = (size_t)this;
  std::stack<Door*,std::deque<Door*,std::allocator<Door*>>>::
  stack<std::deque<Door*,std::allocator<Door*>>,void>
            ((stack<Door*,std::deque<Door*,std::allocator<Door*>>> *)this);
  this->max_size_ = local_18;
  this->bounded_ = local_18 != 0;
  local_1c = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&this->timeout_,&local_1c);
  memset(&this->mutex_,0,0x28);
  std::mutex::mutex(&this->mutex_);
  std::condition_variable::condition_variable(&this->queue_full_);
  std::condition_variable::condition_variable(&this->queue_empty_);
  return;
}

Assistant:

ConcurrentStack(const size_t capacity = 10) :
            max_size_(capacity), bounded_(capacity > 0) {}